

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverviewExamples.cpp
# Opt level: O3

Sandwich * createSandwichForTest(void)

{
  Sandwich *extraout_RAX;
  Sandwich *extraout_RAX_00;
  Sandwich *pSVar1;
  long *plVar2;
  long *in_RDI;
  long lVar3;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  *in_RDI = (long)(in_RDI + 2);
  in_RDI[1] = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  std::__cxx11::string::_M_replace((ulong)in_RDI,0,(char *)0x0,0x1974a4);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Mayo","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Pepper","");
  plVar2 = local_40;
  local_50[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Olive Oil","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(in_RDI + 4),
             local_90,&stack0xffffffffffffffd0);
  lVar3 = -0x60;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Tomato","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Lettuce","");
  plVar2 = local_40;
  local_50[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Cheddar","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(in_RDI + 7),
             local_90,&stack0xffffffffffffffd0);
  lVar3 = -0x60;
  pSVar1 = extraout_RAX;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
      pSVar1 = extraout_RAX_00;
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return pSVar1;
}

Assistant:

static Sandwich createSandwichForTest()
{
    Sandwich result;
    result.bread = "Sourdough";
    result.condiments.contents = {"Mayo", "Pepper", "Olive Oil"};
    result.fillings.contents = {"Tomato", "Lettuce", "Cheddar"};
    return result;
}